

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool duckdb_re2::RE2::Extract(StringPiece *text,RE2 *re,StringPiece *rewrite,string *out)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  RE2 *in_RSI;
  StringPiece *in_RDI;
  int nvec;
  StringPiece vec [17];
  int in_stack_0000023c;
  StringPiece *in_stack_00000240;
  StringPiece *in_stack_00000248;
  string *in_stack_00000250;
  RE2 *in_stack_00000258;
  StringPiece *in_stack_000012d0;
  Anchor in_stack_000012dc;
  size_t in_stack_000012e0;
  size_t in_stack_000012e8;
  StringPiece *in_stack_000012f0;
  RE2 *in_stack_000012f8;
  int in_stack_00001310;
  StringPiece *rewrite_00;
  StringPiece *local_148;
  StringPiece local_138 [17];
  StringPiece local_28;
  RE2 *local_18;
  StringPiece *local_10;
  bool local_1;
  
  local_148 = local_138;
  rewrite_00 = &local_28;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    StringPiece::StringPiece(local_148);
    local_148 = local_148 + 1;
  } while (local_148 != rewrite_00);
  iVar2 = MaxSubmatch(rewrite_00);
  iVar3 = NumberOfCapturingGroups(local_18);
  if (iVar3 + 1 < iVar2 + 1) {
    local_1 = false;
  }
  else if (iVar2 + 1 < 0x12) {
    StringPiece::size(local_10);
    bVar1 = Match(in_stack_000012f8,in_stack_000012f0,in_stack_000012e8,in_stack_000012e0,
                  in_stack_000012dc,in_stack_000012d0,in_stack_00001310);
    if (bVar1) {
      std::__cxx11::string::clear();
      local_1 = Rewrite(in_stack_00000258,in_stack_00000250,in_stack_00000248,in_stack_00000240,
                        in_stack_0000023c);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool RE2::Extract(const StringPiece& text,
                  const RE2& re,
                  const StringPiece& rewrite,
                  std::string* out) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > 1 + re.NumberOfCapturingGroups())
    return false;
  if (nvec > static_cast<int>(arraysize(vec)))
    return false;
  if (!re.Match(text, 0, text.size(), UNANCHORED, vec, nvec))
    return false;

  out->clear();
  return re.Rewrite(out, rewrite, vec, nvec);
}